

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_fsp.cpp
# Opt level: O0

void __thiscall ON_FixedSizePool::Destroy(ON_FixedSizePool *this)

{
  void *pvVar1;
  void *next;
  void *p;
  ON_FixedSizePool *this_local;
  
  next = this->m_first_block;
  memset(this,0,0x48);
  while (next != (void *)0x0) {
    pvVar1 = *next;
    onfree(next);
    next = pvVar1;
  }
  return;
}

Assistant:

void ON_FixedSizePool::Destroy()
{
  void* p;
  void* next;
  next = m_first_block;
  memset(this,0,sizeof(*this));
  for ( p = next; 0 != p; p = next )
  {
    next = *((void**)p);
    onfree(p);
  }
}